

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementHandle.cpp
# Opt level: O3

void __thiscall
Rml::ElementHandle::OnAttributeChange(ElementHandle *this,ElementAttributes *changed_attributes)

{
  const_iterator cVar1;
  
  Element::OnAttributeChange(&this->super_Element,changed_attributes);
  cVar1 = itlib::
          flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
          ::find<char[12]>(changed_attributes,(char (*) [12])"move_target");
  if (((cVar1._M_current ==
        (changed_attributes->m_container).
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) &&
      (cVar1 = itlib::
               flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
               ::find<char[12]>(changed_attributes,(char (*) [12])"size_target"),
      cVar1._M_current ==
      (changed_attributes->m_container).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) &&
     (cVar1 = itlib::
              flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
              ::find<char[12]>(changed_attributes,(char (*) [12])"edge_margin"),
     cVar1._M_current ==
     (changed_attributes->m_container).
     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
     ._M_impl.super__Vector_impl_data._M_finish)) {
    return;
  }
  this->initialised = false;
  this->move_target = (Element *)0x0;
  this->size_target = (Element *)0x0;
  return;
}

Assistant:

void ElementHandle::OnAttributeChange(const ElementAttributes& changed_attributes)
{
	Element::OnAttributeChange(changed_attributes);

	// Reset initialised state if the move or size targets have changed.
	if (changed_attributes.find("move_target") != changed_attributes.end() || changed_attributes.find("size_target") != changed_attributes.end() ||
		changed_attributes.find("edge_margin") != changed_attributes.end())
	{
		initialised = false;
		move_target = nullptr;
		size_target = nullptr;
	}
}